

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  uv_stream_t *stream;
  uv_loop_t *puVar6;
  __pid_t __pid;
  __pid_t _Var7;
  int iVar8;
  int (*pipes) [2];
  long *plVar9;
  ssize_t sVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int (*fds) [2];
  uv_rwlock_t *rwlock;
  ulong uVar15;
  long lVar16;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  undefined8 local_68;
  ulong local_60;
  int local_58;
  uint local_54;
  uv_process_t *local_50;
  uv_loop_t *local_48;
  void **local_40;
  ulong local_38;
  
  local_68 = 0xffffffffffffffff;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x193,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x198,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar12 = 3;
  if (3 < options->stdio_count) {
    uVar12 = (ulong)(uint)options->stdio_count;
  }
  pipes = (int (*) [2])uv__malloc(uVar12 * 8);
  local_38 = uVar12;
  if (pipes == (int (*) [2])0x0) {
    uVar14 = 0xfffffff4;
  }
  else {
    local_60 = uVar12;
    local_50 = process;
    local_48 = loop;
    local_40 = ppvVar1;
    memset(pipes,0xff,uVar12 * 8);
    if (0 < options->stdio_count) {
      lVar13 = 8;
      lVar16 = 0;
      fds = pipes;
      do {
        puVar4 = options->stdio;
        uVar3 = *(uint *)((long)puVar4 + lVar13 + -8);
        uVar14 = uVar3 & 7;
        switch(uVar14) {
        case 0:
          break;
        case 1:
          lVar5 = *(long *)((long)&puVar4->flags + lVar13);
          if (lVar5 == 0) {
            __assert_fail("container->data.stream != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                          ,199,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
          }
          uVar14 = 0xffffffea;
          if (*(int *)(lVar5 + 0x10) == 7) {
            uVar14 = uv__make_socketpair(*fds,0);
          }
          break;
        case 2:
        case 4:
          plVar9 = (long *)((long)&puVar4->flags + lVar13);
          if ((uVar3 & 2) == 0) {
            plVar9 = (long *)(*plVar9 + 0xb8);
          }
          if ((int)*plVar9 == -1) {
            uVar14 = 0xffffffea;
          }
          else {
            (*fds)[1] = (int)*plVar9;
            uVar14 = 0;
          }
          break;
        default:
          __assert_fail("0 && \"Unexpected flags\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                        ,0xdb,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (uVar14 != 0) goto LAB_005a26d3;
        lVar16 = lVar16 + 1;
        fds = fds + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar16 < options->stdio_count);
    }
    uVar14 = uv__make_pipe((int *)&local_68,0);
    puVar6 = local_48;
    if (uVar14 == 0) {
      uv_signal_start(&local_48->child_watcher,uv__chld,0x11);
      rwlock = &puVar6->cloexec_lock;
      uv_rwlock_wrlock(rwlock);
      __pid = fork();
      if (__pid != -1) {
        if (__pid == 0) {
          uv__process_child_init(options,(int)local_60,pipes,local_68._4_4_);
LAB_005a2984:
          __assert_fail("err == pid",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                        ,0x1f1,
                        "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
        }
        uv_rwlock_wrunlock(rwlock);
        uv__close(local_68._4_4_);
        local_50->status = 0;
        local_54 = 0;
        do {
          sVar10 = read((int)local_68,&local_54,4);
          if (sVar10 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        if (sVar10 != 0) {
          if (sVar10 == 4) {
            do {
              _Var7 = waitpid(__pid,&local_58,0);
              if (_Var7 != -1) break;
              piVar11 = __errno_location();
            } while (*piVar11 == 4);
            if (_Var7 != __pid) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                            ,0x1ec,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
          else {
            if ((sVar10 != -1) || (piVar11 = __errno_location(), *piVar11 != 0x20)) {
LAB_005a296b:
              abort();
            }
            do {
              _Var7 = waitpid(__pid,&local_58,0);
              if (_Var7 != -1) break;
            } while (*piVar11 == 4);
            if (_Var7 != __pid) goto LAB_005a2984;
          }
        }
        local_60 = CONCAT44(local_60._4_4_,__pid);
        uv__close_nocheckstdio((int)local_68);
        if (0 < options->stdio_count) {
          lVar13 = 0;
          lVar16 = 0;
          do {
            puVar4 = options->stdio;
            uVar14 = 0;
            if (((*(byte *)((long)&puVar4->flags + lVar13) & 1) != 0) &&
               (uVar14 = 0, -1 < pipes[lVar16][0])) {
              iVar8 = uv__close(pipes[lVar16][1]);
              if (iVar8 != 0) goto LAB_005a296b;
              pipes[lVar16][1] = -1;
              uv__nonblock_ioctl(pipes[lVar16][0],1);
              stream = *(uv_stream_t **)((long)&puVar4->data + lVar13);
              if ((stream->type != UV_NAMED_PIPE) || (iVar8 = 0x60, *(int *)&stream[1].data == 0)) {
                iVar8 = (uint)(lVar13 == 0) * 0x20 + 0x20;
              }
              uVar14 = uv__stream_open(stream,pipes[lVar16][0],iVar8);
            }
            if (uVar14 != 0) goto joined_r0x005a28c8;
            lVar16 = lVar16 + 1;
            lVar13 = lVar13 + 0x10;
          } while (lVar16 < options->stdio_count);
        }
        if (local_54 == 0) {
          local_50->queue[0] = local_48->process_handles;
          plVar9 = (long *)local_48->process_handles[1];
          local_50->queue[1] = plVar9;
          *plVar9 = (long)local_40;
          local_48->process_handles[1] = local_40;
          uVar14 = local_50->flags;
          if (((uVar14 >> 0xe & 1) == 0) &&
             (local_50->flags = uVar14 | 0x4000, (uVar14 >> 0xd & 1) != 0)) {
            puVar2 = &local_50->loop->active_handles;
            *puVar2 = *puVar2 + 1;
          }
        }
        local_50->pid = (int)local_60;
        local_50->exit_cb = options->exit_cb;
        uVar14 = local_54;
        goto LAB_005a271f;
      }
      piVar11 = __errno_location();
      uVar14 = -*piVar11;
      uv_rwlock_wrunlock(rwlock);
      uv__close((int)local_68);
      uv__close(local_68._4_4_);
    }
  }
LAB_005a26d3:
  uVar12 = local_38;
  if (pipes == (int (*) [2])0x0) {
    return uVar14;
  }
  uVar15 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar15) ||
       ((options->stdio[uVar15].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar15][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][0]);
      }
      if (pipes[uVar15][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][1]);
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar12);
LAB_005a271f:
  uv__free(pipes);
  return uVar14;
joined_r0x005a28c8:
  for (; lVar13 != 0; lVar13 = lVar13 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar13) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar13 + -8));
    }
  }
  goto LAB_005a26d3;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return -ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = uv__malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  uv__free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }
    uv__free(pipes);
  }

  return err;
#endif
}